

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::AddSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  bool bVar1;
  reference pbVar2;
  ulong uVar3;
  cmTargetInternals *pcVar4;
  cmCompiledGeneratorExpression *this_00;
  TargetPropertyEntry *this_01;
  auto_ptr<cmCompiledGeneratorExpression> local_110;
  TargetPropertyEntry *local_108;
  cmGeneratorExpression local_100;
  cmCompiledGeneratorExpression *local_f8;
  auto_ptr<cmCompiledGeneratorExpression> local_f0;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  string local_a8;
  char *local_88;
  char *src;
  undefined1 local_70 [8];
  string filename;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  const_iterator i;
  char *sep;
  string srcFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *srcs_local;
  cmTarget *this_local;
  
  srcFiles.field_2._8_8_ = srcs;
  std::__cxx11::string::string((string *)&sep);
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9a61b7;
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)srcFiles.field_2._8_8_);
  while( true ) {
    filename.field_2._8_8_ =
         (size_type)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(srcFiles.field_2._8_8_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&filename.field_2 + 8));
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_48);
    std::__cxx11::string::string((string *)local_70,(string *)pbVar2);
    local_88 = (char *)std::__cxx11::string::c_str();
    if ((*local_88 == '$') && (local_88[1] == '<')) {
LAB_005fb2ba:
      std::__cxx11::string::operator+=((string *)&sep,(char *)i._M_current);
      std::__cxx11::string::operator+=((string *)&sep,(string *)local_70);
      i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x960d97;
      bVar1 = false;
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
LAB_005fb29d:
        cmMakefile::GetOrCreateSource(this->Makefile,(string *)local_70,false);
        goto LAB_005fb2ba;
      }
      ProcessSourceItemCMP0049(&local_a8,this,(string *)local_70);
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) goto LAB_005fb29d;
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)local_70);
    if (bVar1) goto LAB_005fb571;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_48);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
    ::clear(&pcVar4->SourceFilesMap);
    this->LinkImplementationLanguageIsContextDependent = true;
    cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge,this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)&cge,(cmListFileBacktrace *)&ge);
    cmGeneratorExpression::Parse(&local_100,(string *)&cge);
    local_f8 = (cmCompiledGeneratorExpression *)
               cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_100);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              (&local_f0,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_f8);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_100);
    this_00 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_f0);
    cmCompiledGeneratorExpression::SetEvaluateForBuildsystem(this_00,true);
    pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
    this_01 = (TargetPropertyEntry *)operator_new(0x10);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_110,&local_f0);
    cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
              (this_01,&local_110,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
    local_108 = this_01;
    std::
    vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
    ::push_back(&pcVar4->SourceEntries,&local_108);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_110);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_f0);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge);
  }
LAB_005fb571:
  std::__cxx11::string::~string((string *)&sep);
  return;
}

Assistant:

void cmTarget::AddSources(std::vector<std::string> const& srcs)
{
  std::string srcFiles;
  const char* sep = "";
  for(std::vector<std::string>::const_iterator i = srcs.begin();
      i != srcs.end(); ++i)
    {
    std::string filename = *i;
    const char* src = filename.c_str();

    if(!(src[0] == '$' && src[1] == '<'))
      {
      if(!filename.empty())
        {
        filename = this->ProcessSourceItemCMP0049(filename);
        if(filename.empty())
          {
          return;
          }
        }
      this->Makefile->GetOrCreateSource(filename);
      }
    srcFiles += sep;
    srcFiles += filename;
    sep = ";";
    }
  if (!srcFiles.empty())
    {
    this->Internal->SourceFilesMap.clear();
    this->LinkImplementationLanguageIsContextDependent = true;
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(srcFiles);
    cge->SetEvaluateForBuildsystem(true);
    this->Internal->SourceEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
}